

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

char * passphrase_callback(archive *a,void *_client_data)

{
  char *pcVar1;
  int *piVar2;
  
  pcVar1 = *(char **)((long)_client_data + 0x120);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)malloc(0x400);
    *(char **)((long)_client_data + 0x120) = pcVar1;
    if (pcVar1 == (char *)0x0) {
      piVar2 = __errno_location();
      lafe_errc(1,*piVar2,"Out of memory");
    }
  }
  pcVar1 = lafe_readpassphrase("Enter passphrase:",pcVar1,0x400);
  return pcVar1;
}

Assistant:

const char *
passphrase_callback(struct archive *a, void *_client_data)
{
	struct bsdtar *bsdtar = (struct bsdtar *)_client_data;
	(void)a; /* UNUSED */

	if (bsdtar->ppbuff == NULL) {
		bsdtar->ppbuff = malloc(PPBUFF_SIZE);
		if (bsdtar->ppbuff == NULL)
			lafe_errc(1, errno, "Out of memory");
	}
	return lafe_readpassphrase("Enter passphrase:",
		bsdtar->ppbuff, PPBUFF_SIZE);
}